

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::addDouble(Builder *this,double v)

{
  long lVar1;
  
  reserve(this,9);
  appendByteUnchecked(this,'\x1b');
  for (lVar1 = -8; lVar1 != 0; lVar1 = lVar1 + 1) {
    appendByteUnchecked(this,SUB81(v,0));
    v = (double)((ulong)v >> 8);
  }
  return;
}

Assistant:

void addDouble(double v) {
    uint64_t dv;
    ValueLength vSize = sizeof(double);
    memcpy(&dv, &v, vSize);
    reserve(1 + vSize);
    appendByteUnchecked(0x1b);
    for (uint64_t x = dv; vSize > 0; vSize--) {
      appendByteUnchecked(x & 0xff);
      x >>= 8;
    }
  }